

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64_t max_mem)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  Workq *this_00;
  undefined8 in_RCX;
  long lVar6;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int64_t one_state;
  int nnext;
  int nstack;
  int nmark;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Workq *in_stack_ffffffffffffff30;
  long lVar7;
  undefined8 *local_78;
  int local_30;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  Mutex::Mutex((Mutex *)in_stack_ffffffffffffff30);
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  PODArray<int>::PODArray((PODArray<int> *)0x246140);
  Mutex::Mutex((Mutex *)in_stack_ffffffffffffff30);
  in_RDI[0x14] = in_RCX;
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::unordered_set((unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                   *)0x24617c);
  local_78 = in_RDI + 0x1d;
  do {
    StartInfo::StartInfo((StartInfo *)0x2461aa);
    local_78 = local_78 + 2;
  } while (local_78 != in_RDI + 0x2d);
  local_30 = 0;
  if (*(int *)(in_RDI + 1) == 1) {
    local_30 = Prog::size((Prog *)*in_RDI);
  }
  iVar1 = Prog::inst_count((Prog *)*in_RDI,kInstCapture);
  iVar2 = Prog::inst_count((Prog *)*in_RDI,kInstEmptyWidth);
  iVar3 = Prog::inst_count((Prog *)*in_RDI,kInstNop);
  in_RDI[0x14] = in_RDI[0x14] + -0x168;
  iVar4 = Prog::size((Prog *)*in_RDI);
  in_RDI[0x14] = in_RDI[0x14] + (long)(iVar4 + local_30) * -0x10;
  in_RDI[0x14] = in_RDI[0x14] + (long)(local_30 + 1 + iVar1 + iVar2 + iVar3) * -4;
  if ((long)in_RDI[0x14] < 0) {
    *(undefined1 *)((long)in_RDI + 0xc) = 1;
  }
  else {
    in_RDI[0x15] = in_RDI[0x14];
    iVar1 = Prog::bytemap_range((Prog *)*in_RDI);
    lVar7 = (long)(iVar1 + 1) * 8 + 0x10;
    iVar2 = Prog::list_count((Prog *)*in_RDI);
    lVar6 = lVar7 + (long)(iVar2 + local_30) * 4;
    if (SBORROW8(in_RDI[0x15],lVar6 * 0x14) == in_RDI[0x15] + lVar6 * -0x14 < 0) {
      pvVar5 = operator_new(0x38);
      iVar4 = (int)((ulong)lVar7 >> 0x20);
      Prog::size((Prog *)*in_RDI);
      Workq::Workq(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      in_RDI[9] = pvVar5;
      this_00 = (Workq *)operator_new(0x38);
      iVar3 = Prog::size((Prog *)*in_RDI);
      Workq::Workq(this_00,iVar3,in_stack_ffffffffffffff28);
      in_RDI[10] = this_00;
      PODArray<int>::PODArray((PODArray<int> *)CONCAT44(iVar1,iVar2),iVar4);
      PODArray<int>::operator=
                ((PODArray<int> *)this_00,(PODArray<int> *)CONCAT44(iVar3,in_stack_ffffffffffffff28)
                );
      PODArray<int>::~PODArray((PODArray<int> *)0x2464ae);
    }
    else {
      *(undefined1 *)((long)in_RDI + 0xc) = 1;
    }
  }
  return;
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64_t max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    mem_budget_(max_mem) {
  if (ExtraDebug)
    fprintf(stderr, "\nkind %d\n%s\n", (int)kind_, prog_->DumpUnanchored().c_str());
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  int nstack = prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) +
               nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, stack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nstack * sizeof(int);  // stack
  if (mem_budget_ < 0) {
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64_t one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                      (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  stack_ = PODArray<int>(nstack);
}